

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

bool __thiscall
andres::
BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Plus<int,_int,_int>_>
::isSimple(BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Plus<int,_int,_int>_>
           *this)

{
  CoordinateOrder CVar1;
  View<int,_false,_std::allocator<unsigned_long>_> *pVVar2;
  
  pVVar2 = this->e1_;
  View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(pVVar2);
  if (((pVVar2->geometry_).isSimple_ == true) &&
     (pVVar2 = this->e2_, View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(pVVar2),
     (pVVar2->geometry_).isSimple_ == true)) {
    pVVar2 = this->e1_;
    View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(pVVar2);
    CVar1 = (pVVar2->geometry_).coordinateOrder_;
    pVVar2 = this->e2_;
    View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(pVVar2);
    return CVar1 == (pVVar2->geometry_).coordinateOrder_;
  }
  return false;
}

Assistant:

const bool isSimple() const
        { return e1_.isSimple() && e2_.isSimple() 
                 && e1_.coordinateOrder() == e2_.coordinateOrder(); }